

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

aiColor3D __thiscall
Assimp::FBX::FBXConverter::GetColorProperty
          (FBXConverter *this,PropertyTable *props,string *colorName,bool *result,bool useTemplate)

{
  ai_real aVar1;
  undefined7 in_register_00000081;
  byte in_R9B;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 uVar2;
  ai_real aVar3;
  aiVector3t<float> aVar4;
  aiColor3D aVar5;
  undefined8 local_60;
  ai_real local_58;
  undefined8 local_4c;
  ai_real local_44;
  undefined8 *local_40;
  aiVector3D *ColorVec;
  bool ok;
  undefined1 *puStack_30;
  bool useTemplate_local;
  bool *result_local;
  string *colorName_local;
  PropertyTable *props_local;
  FBXConverter *this_local;
  
  puStack_30 = (undefined1 *)CONCAT71(in_register_00000081,useTemplate);
  ColorVec._7_1_ = in_R9B & 1;
  *puStack_30 = 1;
  result_local = result;
  colorName_local = colorName;
  props_local = props;
  this_local = this;
  aVar4 = PropertyGet<aiVector3t<float>>
                    ((PropertyTable *)colorName,(string *)result,(bool *)((long)&ColorVec + 6),
                     (bool)ColorVec._7_1_);
  local_60 = aVar4._0_8_;
  local_4c = local_60;
  uVar2 = local_4c;
  local_58 = aVar4.z;
  local_44 = local_58;
  local_40 = &local_4c;
  if ((ColorVec._6_1_ & 1) == 0) {
    *puStack_30 = 0;
    aVar3 = 0.0;
    aiColor3D::aiColor3D((aiColor3D *)this,0.0,0.0,0.0);
    uVar2 = extraout_XMM0_Qa;
    local_4c._4_4_ = aVar3;
  }
  else {
    local_4c._0_4_ = aVar4.x;
    aVar3 = (ai_real)local_4c;
    local_4c._4_4_ = aVar4.y;
    aVar1 = local_4c._4_4_;
    local_4c = uVar2;
    aiColor3D::aiColor3D((aiColor3D *)this,aVar3,aVar1,local_58);
    uVar2 = extraout_XMM0_Qa_00;
  }
  aVar5.b = local_4c._4_4_;
  aVar5.r = (ai_real)(int)uVar2;
  aVar5.g = (ai_real)(int)((ulong)uVar2 >> 0x20);
  return aVar5;
}

Assistant:

aiColor3D FBXConverter::GetColorProperty(const PropertyTable& props, const std::string& colorName,
            bool& result, bool useTemplate)
        {
            result = true;
            bool ok;
            const aiVector3D& ColorVec = PropertyGet<aiVector3D>(props, colorName, ok, useTemplate);
            if (!ok) {
                result = false;
                return aiColor3D(0.0f, 0.0f, 0.0f);
            }
            return aiColor3D(ColorVec.x, ColorVec.y, ColorVec.z);
        }